

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

Sbm_Man_t * Sbm_ManAlloc(int LogN)

{
  int iVar1;
  Sbm_Man_t *pSVar2;
  sat_solver *psVar3;
  Vec_Int_t *pVVar4;
  Vec_Wec_t *pVVar5;
  Vec_Wrd_t *pVVar6;
  Sbm_Man_t *p;
  int LogN_local;
  
  pSVar2 = (Sbm_Man_t *)calloc(1,0x88);
  psVar3 = Sbm_AddCardinSolver(LogN,&pSVar2->vCardVars);
  pSVar2->pSat = psVar3;
  pSVar2->LogN = LogN;
  iVar1 = sat_solver_nvars(pSVar2->pSat);
  pSVar2->FirstVar = iVar1;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vRoots = pVVar4;
  pVVar5 = Vec_WecAlloc(1000);
  pSVar2->vCuts = pVVar5;
  pVVar5 = Vec_WecAlloc(1000);
  pSVar2->vObjCuts = pVVar5;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vSolCuts = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vCutGates = pVVar4;
  pVVar6 = Vec_WrdAlloc(100);
  pSVar2->vCutAreas = pVVar6;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vAssump = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vPolar = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vArrs = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vReqs = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vLit2Used = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vDelays = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vReason = pVVar4;
  return pSVar2;
}

Assistant:

Sbm_Man_t * Sbm_ManAlloc( int LogN )
{
    Sbm_Man_t * p = ABC_CALLOC( Sbm_Man_t, 1 );
    p->pSat = Sbm_AddCardinSolver( LogN, &p->vCardVars );
    p->LogN = LogN;
    p->FirstVar  = sat_solver_nvars( p->pSat );
    // window
    p->vRoots    = Vec_IntAlloc( 100 );
    p->vCuts     = Vec_WecAlloc( 1000 );
    p->vObjCuts  = Vec_WecAlloc( 1000 );
    p->vSolCuts  = Vec_IntAlloc( 100 );
    p->vCutGates = Vec_IntAlloc( 100 );
    p->vCutAreas = Vec_WrdAlloc( 100 );
    // solver
    p->vAssump   = Vec_IntAlloc( 100 );
    p->vPolar    = Vec_IntAlloc( 100 );
    // timing
    p->vArrs     = Vec_IntAlloc( 100 );
    p->vReqs     = Vec_IntAlloc( 100 );
    // internal
    p->vLit2Used = Vec_IntAlloc( 100 );
    p->vDelays   = Vec_IntAlloc( 100 );
    p->vReason   = Vec_IntAlloc( 100 );
    return p;
}